

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bsdunzip.c
# Opt level: O2

int main(int argc,char **argv)

{
  undefined8 uVar1;
  int iVar2;
  char *pcVar3;
  int iVar4;
  int extraout_EDX;
  ulong uVar5;
  int iVar6;
  long lVar7;
  long lVar8;
  ulong uVar9;
  long lVar10;
  long lVar11;
  bool bVar12;
  int local_54;
  char *local_38;
  
  lafe_setprogname(*argv,"bsdunzip");
  pcVar3 = setlocale(6,"");
  if (pcVar3 == (char *)0x0) {
    lafe_warnc(0,"Failed to set default locale");
  }
  iVar2 = isatty(1);
  if (iVar2 != 0) {
    tty = 1;
  }
  pcVar3 = getenv("UNZIP_DEBUG");
  if (pcVar3 != (char *)0x0) {
    unzip_debug = 1;
  }
  lVar8 = (long)(argc + -1);
  uVar9 = 0;
  if (0 < argc) {
    uVar9 = (ulong)(uint)argc;
  }
  for (uVar5 = 0; uVar9 != uVar5; uVar5 = uVar5 + 1) {
    uVar1 = 10;
    if ((long)uVar5 < lVar8) {
      uVar1 = 0x20;
    }
    debug("%s%c",argv[uVar5],uVar1);
  }
  setenv("POSIXLY_CORRECT","",1);
  iVar2 = getopts(argc,argv);
  if (version_opt != '\0') {
    pcVar3 = archive_version_details();
    printf("bsdunzip %s - %s \n","3.8.0",pcVar3);
    goto LAB_001038f0;
  }
  if ((zipinfo_mode == '\x01') && ((Z1_opt & 1) == 0)) {
    puts("Zipinfo mode needs additional options");
    exit(1);
  }
  iVar4 = argc - iVar2;
  if (iVar4 == 0 || argc < iVar2) {
    usage();
    iVar2 = extraout_EDX;
LAB_0010394c:
    bVar12 = false;
  }
  else {
    lVar8 = (long)iVar2;
    local_38 = argv[lVar8];
    local_54 = iVar4;
    if (*local_38 != '-') goto LAB_0010394c;
    bVar12 = local_38[1] == '\0';
  }
  unzip_exclude_mode = '\0';
  lVar10 = (long)argc;
  lVar11 = lVar8 << 0x20;
  lVar7 = 0;
  while ((lVar8 + 1 + lVar7 < lVar10 && (*argv[lVar8 + lVar7 + 1] != '-'))) {
    add_pattern(&include,argv[lVar8 + lVar7 + 1]);
    lVar7 = lVar7 + 1;
    lVar11 = lVar11 + 0x100000000;
  }
  iVar6 = (int)lVar7;
  iVar4 = getopts(local_54 - iVar6,(char **)((lVar11 >> 0x1d) + (long)argv));
  if (unzip_exclude_mode == '\0') {
    iVar2 = iVar2 + iVar6 + iVar4;
  }
  else {
    lVar7 = (long)(iVar2 + iVar4 + iVar6);
    lVar8 = 0;
    while ((lVar7 + lVar8 < lVar10 && (*argv[lVar7 + lVar8] != '-'))) {
      add_pattern(&exclude,argv[lVar7 + lVar8]);
      lVar8 = lVar8 + 1;
    }
    iVar2 = iVar2 + -1 + iVar4 + iVar6 + (int)lVar8;
    iVar4 = getopts((((local_54 - iVar4) - iVar6) - (int)lVar8) + 1,argv + iVar2);
    iVar2 = iVar2 + iVar4;
  }
  for (lVar8 = (long)iVar2; lVar8 < lVar10; lVar8 = lVar8 + 1) {
    add_pattern(&include,argv[lVar8]);
  }
  if (1 < (uint)u_opt + (uint)o_opt + (uint)n_opt) {
    errorx("-n, -o and -u are contradictory");
  }
  if (bVar12) {
    local_38 = (char *)0x0;
  }
  unzip(local_38);
LAB_001038f0:
  exit(0);
}

Assistant:

int
main(int argc, char *argv[])
{
	const char *zipfile;
	int nopts;

	lafe_setprogname(*argv, "bsdunzip");

#if HAVE_SETLOCALE
	if (setlocale(LC_ALL, "") == NULL)
		lafe_warnc(0, "Failed to set default locale");
#endif

	if (isatty(STDOUT_FILENO))
		tty = 1;

	if (getenv("UNZIP_DEBUG") != NULL)
		unzip_debug = 1;
	for (int i = 0; i < argc; ++i)
		debug("%s%c", argv[i], (i < argc - 1) ? ' ' : '\n');

#ifdef __GLIBC__
	/* Prevent GNU getopt(3) from rearranging options. */
	setenv("POSIXLY_CORRECT", "", 1);
#endif
	/*
	 * Info-ZIP's unzip(1) expects certain options to come before the
	 * zipfile name, and others to come after - though it does not
	 * enforce this.  For simplicity, we accept *all* options both
	 * before and after the zipfile name.
	 */
	nopts = getopts(argc, argv);

	if (version_opt == 1)
		version();

	/*
	 * When more of the zipinfo mode options are implemented, this
	 * will need to change.
	 */
	if (zipinfo_mode && !Z1_opt) {
		printf("Zipinfo mode needs additional options\n");
		exit(EXIT_FAILURE);
	}

	if (argc <= nopts)
		usage();
	zipfile = argv[nopts++];

	if (strcmp(zipfile, "-") == 0)
		zipfile = NULL; /* STDIN */

	unzip_exclude_mode = 0;

	while (nopts < argc && *argv[nopts] != '-')
		add_pattern(&include, argv[nopts++]);

	nopts--; /* fake argv[0] */
	nopts += getopts(argc - nopts, argv + nopts);

	/*
	 * For compatibility with Info-ZIP's unzip(1) we need to treat
	 * non-option arguments following an -x after the zipfile as
	 * exclude list members.
	 */
	if (unzip_exclude_mode) {
		while (nopts < argc && *argv[nopts] != '-')
			add_pattern(&exclude, argv[nopts++]);
		nopts--; /* fake argv[0] */
		nopts += getopts(argc - nopts, argv + nopts);
	}

	/* There may be residual arguments if we encountered -- */
	while (nopts < argc)
		add_pattern(&include, argv[nopts++]);

	if (n_opt + o_opt + u_opt > 1)
		errorx("-n, -o and -u are contradictory");

	unzip(zipfile);

	exit(EXIT_SUCCESS);
}